

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O2

ImGuiID __thiscall ImGuiWindow::GetIDFromRectangle(ImGuiWindow *this,ImRect *r_abs)

{
  ImU32 id;
  uint *puVar1;
  float fVar2;
  float fVar3;
  int local_28;
  int iStack_24;
  int iStack_20;
  int iStack_1c;
  
  puVar1 = ImVector<unsigned_int>::back(&this->IDStack);
  fVar2 = (this->Pos).x;
  fVar3 = (this->Pos).y;
  local_28 = (int)((r_abs->Min).x - fVar2);
  iStack_24 = (int)((r_abs->Min).y - fVar3);
  iStack_20 = (int)((r_abs->Max).x - fVar2);
  iStack_1c = (int)((r_abs->Max).y - fVar3);
  id = ImHashData(&local_28,0x10,*puVar1);
  ImGui::KeepAliveID(id);
  return id;
}

Assistant:

ImGuiID ImGuiWindow::GetIDFromRectangle(const ImRect& r_abs)
{
    ImGuiID seed = IDStack.back();
    const int r_rel[4] = { (int)(r_abs.Min.x - Pos.x), (int)(r_abs.Min.y - Pos.y), (int)(r_abs.Max.x - Pos.x), (int)(r_abs.Max.y - Pos.y) };
    ImGuiID id = ImHashData(&r_rel, sizeof(r_rel), seed);
    ImGui::KeepAliveID(id);
    return id;
}